

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

bool __thiscall
draco::PlyReader::ParseElementDataAscii(PlyReader *this,DecoderBuffer *buffer,int element_index)

{
  PlyProperty *property;
  function<void_(double)> *this_00;
  long lVar1;
  bool bVar2;
  pointer pPVar3;
  int v;
  int iVar4;
  long lVar5;
  int32_t num_entries;
  int local_7c;
  float val;
  ulong local_70;
  pointer local_68;
  long local_60;
  PlyPropertyWriter<double> prop_writer;
  
  pPVar3 = (this->elements_).
           super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
           super__Vector_impl_data._M_start + element_index;
  local_70 = 0;
  this_00 = &prop_writer.convert_value_func_;
  local_68 = pPVar3;
  do {
    local_7c = (int)pPVar3->num_entries_;
    if (local_7c <= (int)local_70) {
LAB_0011c7a1:
      return local_7c <= (int)local_70;
    }
    local_60 = 0;
    while( true ) {
      lVar1 = *(long *)&(pPVar3->properties_).
                        super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                        _M_impl;
      if ((int)(((long)*(pointer *)
                        ((long)&(pPVar3->properties_).
                                super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                        + 8) - lVar1) / 0x60) <= local_60) break;
      lVar5 = local_60 * 0x60;
      property = (PlyProperty *)(lVar5 + lVar1);
      PlyPropertyWriter<double>::PlyPropertyWriter(&prop_writer,property);
      num_entries = 1;
      if (*(int *)(lVar1 + 0x58 + lVar5) != 0) {
        parser::SkipWhitespace(buffer);
        bVar2 = parser::ParseSignedInt(buffer,&num_entries);
        if (!bVar2) {
LAB_0011c790:
          std::_Function_base::~_Function_base(&this_00->super__Function_base);
          goto LAB_0011c7a1;
        }
        _val = (ulong)((long)(property->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(property->data_).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) /
               (ulong)(long)property->data_type_num_bytes_;
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  (&property->list_data_,(long *)&val);
        _val = (ulong)num_entries;
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  (&property->list_data_,(long *)&val);
      }
      for (iVar4 = 0; iVar4 < num_entries; iVar4 = iVar4 + 1) {
        parser::SkipWhitespace(buffer);
        if (property->data_type_ - DT_FLOAT32 < 2) {
          bVar2 = parser::ParseFloat(buffer,&val);
          if (!bVar2) goto LAB_0011c790;
          std::function<void_(double)>::operator()(this_00,(double)val);
        }
        else {
          bVar2 = parser::ParseSignedInt(buffer,(int32_t *)&val);
          if (!bVar2) goto LAB_0011c790;
          std::function<void_(double)>::operator()(this_00,(double)(int)val);
        }
      }
      std::_Function_base::~_Function_base(&this_00->super__Function_base);
      local_60 = local_60 + 1;
      pPVar3 = local_68;
    }
    local_70 = (ulong)((int)local_70 + 1);
  } while( true );
}

Assistant:

bool PlyReader::ParseElementDataAscii(DecoderBuffer *buffer,
                                      int element_index) {
  PlyElement &element = elements_[element_index];
  for (int entry = 0; entry < element.num_entries(); ++entry) {
    for (int i = 0; i < element.num_properties(); ++i) {
      PlyProperty &prop = element.property(i);
      PlyPropertyWriter<double> prop_writer(&prop);
      int32_t num_entries = 1;
      if (prop.is_list()) {
        parser::SkipWhitespace(buffer);
        // Parse the number of entries for the list element.
        if (!parser::ParseSignedInt(buffer, &num_entries)) {
          return false;
        }

        // Store offset to the main data entry.
        prop.list_data_.push_back(prop.data_.size() /
                                  prop.data_type_num_bytes_);
        // Store the number of entries.
        prop.list_data_.push_back(num_entries);
      }
      // Read and store the actual property data.
      for (int v = 0; v < num_entries; ++v) {
        parser::SkipWhitespace(buffer);
        if (prop.data_type() == DT_FLOAT32 || prop.data_type() == DT_FLOAT64) {
          float val;
          if (!parser::ParseFloat(buffer, &val)) {
            return false;
          }
          prop_writer.PushBackValue(val);
        } else {
          int32_t val;
          if (!parser::ParseSignedInt(buffer, &val)) {
            return false;
          }
          prop_writer.PushBackValue(val);
        }
      }
    }
  }
  return true;
}